

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void cmFortranParser_RuleIfdef(cmFortranParser *parser,char *macro)

{
  char *pcVar1;
  bool bVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  reference pvVar3;
  _Self local_68 [3];
  allocator local_49;
  key_type local_48;
  _Self local_28;
  value_type local_19;
  char *local_18;
  char *macro_local;
  cmFortranParser *parser_local;
  
  local_19 = false;
  local_18 = macro;
  macro_local = (char *)parser;
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push(&parser->SkipToEnd,&local_19);
  pcVar1 = local_18;
  if (*(long *)(macro_local + 0xe8) == 0) {
    this = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(macro_local + 0xb8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    local_28._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(this,&local_48);
    local_68[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(macro_local + 0xb8));
    bVar2 = std::operator==(&local_28,local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (bVar2) {
      macro_local[0xe8] = '\x01';
      macro_local[0xe9] = '\0';
      macro_local[0xea] = '\0';
      macro_local[0xeb] = '\0';
      macro_local[0xec] = '\0';
      macro_local[0xed] = '\0';
      macro_local[0xee] = '\0';
      macro_local[0xef] = '\0';
    }
    else {
      pvVar3 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top
                         ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)
                          (macro_local + 0xf0));
      *pvVar3 = true;
    }
  }
  else {
    *(long *)(macro_local + 0xe8) = *(long *)(macro_local + 0xe8) + 1;
  }
  return;
}

Assistant:

void cmFortranParser_RuleIfdef(cmFortranParser* parser, const char* macro)
{
  // A new PP branch has been opened
  parser->SkipToEnd.push(false);

  if (parser->InPPFalseBranch) {
    parser->InPPFalseBranch++;
  } else if (parser->PPDefinitions.find(macro) ==
             parser->PPDefinitions.end()) {
    parser->InPPFalseBranch = 1;
  } else {
    parser->SkipToEnd.top() = true;
  }
}